

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O3

int SUNMatCopyOps(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_Ops p_Var1;
  SUNMatrix_Ops p_Var2;
  _func_SUNMatrix_SUNMatrix *p_Var3;
  _func_int_SUNMatrix *p_Var4;
  _func_int_realtype_SUNMatrix_SUNMatrix *p_Var5;
  _func_int_SUNMatrix_long_ptr_long_ptr *p_Var6;
  int iVar7;
  
  iVar7 = -1;
  if (((B != (SUNMatrix)0x0 && A != (SUNMatrix)0x0) &&
      (p_Var1 = A->ops, p_Var1 != (SUNMatrix_Ops)0x0)) &&
     (p_Var2 = B->ops, p_Var2 != (SUNMatrix_Ops)0x0)) {
    p_Var3 = p_Var1->clone;
    p_Var2->getid = p_Var1->getid;
    p_Var2->clone = p_Var3;
    p_Var4 = p_Var1->zero;
    p_Var2->destroy = p_Var1->destroy;
    p_Var2->zero = p_Var4;
    p_Var5 = p_Var1->scaleadd;
    p_Var2->copy = p_Var1->copy;
    p_Var2->scaleadd = p_Var5;
    p_Var4 = p_Var1->matvecsetup;
    p_Var2->scaleaddi = p_Var1->scaleaddi;
    p_Var2->matvecsetup = p_Var4;
    p_Var6 = p_Var1->space;
    p_Var2->matvec = p_Var1->matvec;
    p_Var2->space = p_Var6;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int SUNMatCopyOps(SUNMatrix A, SUNMatrix B)
{
  /* Check that ops structures exist */
  if (A == NULL || B == NULL) return(-1);
  if (A->ops == NULL || B->ops == NULL) return(-1);

  /* Copy ops from A to B */
  B->ops->getid       = A->ops->getid;
  B->ops->clone       = A->ops->clone;
  B->ops->destroy     = A->ops->destroy;
  B->ops->zero        = A->ops->zero;
  B->ops->copy        = A->ops->copy;
  B->ops->scaleadd    = A->ops->scaleadd;
  B->ops->scaleaddi   = A->ops->scaleaddi;
  B->ops->matvecsetup = A->ops->matvecsetup;
  B->ops->matvec      = A->ops->matvec;
  B->ops->space       = A->ops->space;

  return(0);
}